

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O0

void ftd2f_(double *A1,int *A2,char *A3,int *A4,size_t C3)

{
  double dval;
  int decim;
  char *s;
  char *cval;
  size_t sVar1;
  size_t sVar2;
  size_t local_88;
  unsigned_long local_70;
  char local_58 [8];
  char str [21];
  char *B3;
  size_t C3_local;
  int *A4_local;
  char *A3_local;
  int *A2_local;
  double *A1_local;
  
  dval = *A1;
  decim = *A2;
  local_70 = C3;
  if (C3 <= gMinStrLen) {
    local_70 = gMinStrLen;
  }
  s = (char *)malloc(local_70 + 1);
  s[C3] = '\0';
  memcpy(s,A3,C3);
  cval = kill_trailing(s,' ');
  ffd2f(dval,decim,cval,A4);
  snprintf(local_58,0x15,"%20s",s);
  strcpy(s,local_58);
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    local_88 = C3;
    if (sVar1 < C3) {
      local_88 = strlen(s);
    }
    memcpy(A3,s,local_88);
    sVar1 = strlen(s);
    if (sVar1 < C3) {
      sVar1 = strlen(s);
      sVar2 = strlen(s);
      memset(A3 + sVar1,0x20,C3 - sVar2);
    }
    free(s);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTD2F,ftd2f)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),DOUBLE,INT,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(DOUBLE,1)
   QCF(INT,2)
   QCF(PSTRING,3)
   QCF(PINT,4)
   char str[21];

   ffd2f( TCF(ftd2f,DOUBLE,1,0) 
          TCF(ftd2f,INT,2,1) 
          TCF(ftd2f,PSTRING,3,1) 
          TCF(ftd2f,PINT,4,1) );

   snprintf(str,21,"%20s",B3);
   strcpy(B3,str);

   RCF(DOUBLE,1)
   RCF(INT,2)
   RCF(PSTRING,3)
   RCF(PINT,4)
}